

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* egc::StringUtil::Split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *string,char delimiter)

{
  value_type local_80;
  value_type local_50;
  long local_30;
  size_t current;
  size_t previous;
  string *psStack_18;
  char delimiter_local;
  string *string_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parsed;
  
  previous._6_1_ = 0;
  previous._7_1_ = delimiter;
  psStack_18 = string;
  string_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  current = 0;
  local_30 = std::__cxx11::string::find((char)psStack_18,(ulong)(uint)(int)previous._7_1_);
  while (local_30 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)psStack_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    current = local_30 + 1;
    local_30 = std::__cxx11::string::find((char)psStack_18,(ulong)(uint)(int)previous._7_1_);
  }
  std::__cxx11::string::substr((ulong)&local_80,(ulong)psStack_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> egc::StringUtil::Split (const std::string& string, char delimiter)
{
    std::vector<std::string> parsed;

    std::size_t previous = 0, current = string.find(delimiter);
    while (current != std::string::npos)
    {
        parsed.push_back(string.substr(previous, current - previous));
        previous = current + 1;
        current = string.find(delimiter, previous);
    }
    parsed.push_back(string.substr(previous, current - previous));

    return parsed;
}